

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcPrsMem::reset(CTcPrsMem *this,tcprsmem_state_t *state)

{
  undefined8 *puVar1;
  undefined8 *in_RSI;
  long in_RDI;
  tcprsmem_blk_t *nxt;
  tcprsmem_blk_t *cur;
  undefined8 *local_18;
  
  local_18 = *(undefined8 **)*in_RSI;
  while (local_18 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*local_18;
    free(local_18);
    local_18 = puVar1;
  }
  *(undefined8 *)(in_RDI + 8) = *in_RSI;
  **(undefined8 **)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = in_RSI[1];
  *(undefined8 *)(in_RDI + 0x18) = in_RSI[2];
  return;
}

Assistant:

void CTcPrsMem::reset(const tcprsmem_state_t *state)
{
    tcprsmem_blk_t *cur;
    
    /* 
     *   delete all of the blocks that were allocated after the last block
     *   that existed when the state was saved 
     */
    for (cur = state->tail->next_ ; cur != 0 ; )
    {
        tcprsmem_blk_t *nxt;

        /* remember the next block */
        nxt = cur->next_;

        /* delete this block */
        t3free(cur);

        /* move on to the next one */
        cur = nxt;
    }

    /* re-establish the saved last block */
    tail_ = state->tail;

    /* make sure the list is terminated at the last block */
    tail_->next_ = 0;

    /* re-establish the saved allocation point in the last block */
    free_ptr_ = state->free_ptr;
    rem_ = state->rem;
}